

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceBuffer * __thiscall
slang::SourceManager::assignBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view pathStr,
          vector<char,_std::allocator<char>_> *buffer,SourceLocation includedFrom)

{
  bool bVar1;
  runtime_error *this_00;
  string_view str;
  templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>
  local_c8;
  string local_c0;
  templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>
  local_a0;
  iterator it;
  undefined1 local_88 [8];
  shared_lock<std::shared_mutex> lock;
  string_view local_68;
  undefined1 local_58 [8];
  path path;
  vector<char,_std::allocator<char>_> *buffer_local;
  SourceManager *this_local;
  SourceLocation includedFrom_local;
  string_view pathStr_local;
  
  str._M_str = (slang *)pathStr._M_len;
  str._M_len = (size_t)pathStr._M_str;
  lock._8_8_ = str._M_str;
  path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )buffer;
  local_68 = widen(str._M_str,str);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)local_58,&local_68,auto_format);
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_88,&this->mut);
  std::filesystem::__cxx11::path::u8string(&local_c0,(path *)local_58);
  local_a0.current =
       (EntryPointer)
       ska::detailv3::
       sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
       ::find(&(this->lookupCache).
               super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
              ,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  local_c8.current =
       (EntryPointer)
       ska::detailv3::
       sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
       ::end(&(this->lookupCache).
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>_>_>_>_>
            );
  bVar1 = ska::detailv3::operator!=(&local_a0,&local_c8);
  if (!bVar1) {
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_88);
    cacheBuffer(__return_storage_ptr__,this,(path *)local_58,includedFrom,
                (vector<char,_std::allocator<char>_> *)
                path._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl);
    std::filesystem::__cxx11::path::~path((path *)local_58);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Buffer with the given path has already been assigned to the source manager");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SourceBuffer SourceManager::assignBuffer(string_view pathStr, std::vector<char>&& buffer,
                                         SourceLocation includedFrom) {

    // first see if we have this file cached
    fs::path path(widen(pathStr));
    {
        std::shared_lock lock(mut);
        auto it = lookupCache.find(path.u8string());
        if (it != lookupCache.end()) {
            throw std::runtime_error(
                "Buffer with the given path has already been assigned to the source manager");
        }
    }

    return cacheBuffer(path, includedFrom, std::move(buffer));
}